

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O1

int mg_session_send_pull_message(mg_session *session,mg_map *extra)

{
  int iVar1;
  byte local_1a [2];
  
  local_1a[0] = session->version == 4 | 0xb0;
  iVar1 = mg_session_write_raw(session,(char *)local_1a,1);
  if (iVar1 == 0) {
    local_1a[1] = 0x3f;
    iVar1 = mg_session_write_raw(session,(char *)(local_1a + 1),1);
    if ((iVar1 == 0) &&
       ((session->version != 4 || (iVar1 = mg_session_write_map(session,extra), iVar1 == 0)))) {
      iVar1 = mg_session_flush_message(session);
    }
  }
  return iVar1;
}

Assistant:

int mg_session_send_pull_message(mg_session *session, const mg_map *extra) {
  uint8_t marker = MG_MARKER_TINY_STRUCT + (session->version == 4);
  MG_RETURN_IF_FAILED(mg_session_write_uint8(session, marker));
  MG_RETURN_IF_FAILED(
      mg_session_write_uint8(session, MG_SIGNATURE_MESSAGE_PULL));

  if (session->version == 4) {
    MG_RETURN_IF_FAILED(mg_session_write_map(session, extra));
  }

  return mg_session_flush_message(session);
}